

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::InternalCopyNativeFloatArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptNativeFloatArray *srcArray,
               uint32 start,uint32 end)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Var newValue;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint32 count;
  double value;
  undefined1 local_50 [8];
  ArrayElementEnumerator e;
  
  e._16_8_ = dstArray;
  if ((end <= start) ||
     ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length < end))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2d85,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  scriptContext = *(ScriptContext **)(*(long *)(*(long *)(e._16_8_ + 8) + 8) + 0x490);
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_50,(JavascriptArray *)srcArray,start,end);
  if (local_50 == (undefined1  [8])0x0) {
    count = 0;
  }
  else {
    count = 0;
    uVar5 = e.seg._4_4_;
    do {
      uVar7 = (ulong)(uint)e.seg;
      uVar6 = (uint)e.seg + 1;
      if ((uint)e.seg + 1 < uVar5) {
        uVar6 = uVar5;
      }
      do {
        if (uVar6 - 1 == (int)uVar7) {
          local_50 = (undefined1  [8])((Type *)((long)local_50 + 0x10))->ptr;
          e.seg._0_4_ = uVar6;
          if (local_50 == (undefined1  [8])0x0) goto joined_r0x00b93371;
          uVar6 = e.endIndex - ((SparseArraySegmentBase *)local_50)->left;
          if (((SparseArraySegmentBase *)local_50)->left <= e.endIndex && uVar6 != 0) {
            e.seg._0_4_ = 0xffffffff;
            uVar5 = ((SparseArraySegmentBase *)local_50)->length;
            e.seg._4_4_ = uVar5;
            if (uVar6 < uVar5) {
              uVar5 = uVar6;
              e.seg._4_4_ = uVar6;
            }
            goto joined_r0x00b93371;
          }
          local_50 = (undefined1  [8])0x0;
          goto LAB_00b93386;
        }
        e.seg._0_4_ = (int)uVar7 + 1;
        uVar7 = (ulong)(uint)e.seg;
      } while (*(undefined1 **)
                (&((SparseArraySegmentBase *)((long)local_50 + 0x18))->left + uVar7 * 2) ==
               &DAT_fff80002fff80002);
      uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_50);
      value = ArrayElementEnumerator::GetItem<double>((ArrayElementEnumerator *)local_50);
      newValue = JavascriptNumber::ToVarWithCheck(value,scriptContext);
      DirectSetItemAt<void*>((JavascriptArray *)e._16_8_,uVar3 + (dstIndex - start),newValue);
      count = count + 1;
      uVar5 = e.seg._4_4_;
joined_r0x00b93371:
    } while (local_50 != (undefined1  [8])0x0);
  }
LAB_00b93386:
  if (count + start != end) {
    InternalFillFromPrototype
              ((JavascriptArray *)e._16_8_,dstIndex,(JavascriptArray *)srcArray,start,end,count);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyNativeFloatArrayElements(JavascriptArray* dstArray, uint32 dstIndex, JavascriptNativeFloatArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ScriptContext *scriptContext = dstArray->GetScriptContext();
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<double>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, JavascriptNumber::ToVarWithCheck(e.GetItem<double>(), scriptContext));
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }